

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<capnp::compiler::CapnpParser::DeclParserResult>::Maybe
          (Maybe<capnp::compiler::CapnpParser::DeclParserResult> *this,
          Maybe<capnp::compiler::CapnpParser::DeclParserResult> *other)

{
  NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *other_00;
  Maybe<capnp::compiler::CapnpParser::DeclParserResult> *other_local;
  Maybe<capnp::compiler::CapnpParser::DeclParserResult> *this_local;
  
  other_00 = mv<kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>>(&other->ptr);
  kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::NullableValue
            (&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }